

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *this;
  allocator<ListNode_*> *this_00;
  initializer_list<int> __l;
  initializer_list<ListNode_*> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  Solution *this_01;
  ListNode *this_02;
  ListNode *this_03;
  ListNode *this_04;
  ListNode *this_05;
  ListNode *this_06;
  ListNode *this_07;
  ListNode *this_08;
  ListNode *this_09;
  ListNode *this_10;
  vector<int,_std::allocator<int>_> *local_3a0;
  allocator<int> local_329;
  int local_328 [6];
  iterator local_310;
  size_type local_308;
  undefined1 local_300 [8];
  vector<int,_std::allocator<int>_> rotateArray;
  ListNode *local_2e0;
  ListNode *local_2d8;
  ListNode *local_2d0;
  iterator local_2c8;
  size_type local_2c0;
  undefined1 local_2b8 [8];
  vector<ListNode_*,_std::allocator<ListNode_*>_> lists;
  ListNode *seven;
  ListNode *six;
  ListNode *five;
  ListNode *four1;
  ListNode *four;
  ListNode *three;
  ListNode *two;
  ListNode *one1;
  ListNode *one;
  string local_250 [8];
  string strc;
  allocator local_229;
  string local_228 [8];
  string strb;
  allocator local_201;
  string local_200 [8];
  string stra;
  Solution *a;
  int local_1d0 [2];
  iterator local_1c8;
  size_type local_1c0;
  allocator<int> local_1b1;
  int local_1b0 [2];
  iterator local_1a8;
  size_type local_1a0;
  allocator<int> local_191;
  int local_190 [2];
  iterator local_188;
  size_type local_180;
  allocator<int> local_171;
  int local_170 [2];
  iterator local_168;
  size_type local_160;
  allocator<int> local_151;
  int local_150 [2];
  iterator local_148;
  size_type local_140;
  vector<int,_std::allocator<int>_> *local_138;
  vector<int,_std::allocator<int>_> local_130;
  vector<int,_std::allocator<int>_> local_118;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  undefined1 local_b8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ss;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> bb;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> aa;
  
  aa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = 0;
  local_44[0] = 0x3c;
  local_44[1] = 0x3c;
  local_44[2] = 0x3c;
  local_38 = local_44;
  local_30 = 3;
  std::allocator<int>::allocator(&local_45);
  __l_08._M_len = local_30;
  __l_08._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_08,&local_45);
  std::allocator<int>::~allocator(&local_45);
  ss.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  this = (allocator<int> *)
         ((long)&ss.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this);
  __l_07._M_len = 3;
  __l_07._M_array =
       (iterator)
       ((long)&ss.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l_07,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&ss.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  a._6_1_ = 1;
  local_150[0] = 0;
  local_150[1] = 2;
  local_148 = local_150;
  local_140 = 2;
  local_138 = &local_130;
  std::allocator<int>::allocator(&local_151);
  __l_05._M_len = local_140;
  __l_05._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_05,&local_151);
  local_170[0] = 0;
  local_170[1] = 5;
  local_168 = local_170;
  local_160 = 2;
  local_138 = &local_118;
  std::allocator<int>::allocator(&local_171);
  __l_04._M_len = local_160;
  __l_04._M_array = local_168;
  std::vector<int,_std::allocator<int>_>::vector(&local_118,__l_04,&local_171);
  local_190[0] = 2;
  local_190[1] = 4;
  local_188 = local_190;
  local_180 = 2;
  local_138 = &local_100;
  std::allocator<int>::allocator(&local_191);
  __l_03._M_len = local_180;
  __l_03._M_array = local_188;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,__l_03,&local_191);
  local_1b0[0] = 1;
  local_1b0[1] = 6;
  local_1a8 = local_1b0;
  local_1a0 = 2;
  local_138 = &local_e8;
  std::allocator<int>::allocator(&local_1b1);
  __l_02._M_len = local_1a0;
  __l_02._M_array = local_1a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_02,&local_1b1);
  local_1d0[0] = 5;
  local_1d0[1] = 4;
  local_1c8 = local_1d0;
  local_1c0 = 2;
  local_138 = &local_d0;
  std::allocator<int>::allocator((allocator<int> *)((long)&a + 7));
  __l_01._M_len = local_1c0;
  __l_01._M_array = local_1c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_01,(allocator<int> *)((long)&a + 7));
  a._6_1_ = 0;
  local_b8._0_8_ = &local_130;
  local_b8._8_8_ = (pointer)0x5;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 5));
  __l_06._M_len = local_b8._8_8_;
  __l_06._M_array = (iterator)local_b8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_b8 + 0x10),__l_06,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 5));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 5));
  local_3a0 = (vector<int,_std::allocator<int>_> *)local_b8;
  do {
    local_3a0 = local_3a0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_3a0);
  } while (local_3a0 != &local_130);
  std::allocator<int>::~allocator((allocator<int> *)((long)&a + 7));
  std::allocator<int>::~allocator(&local_1b1);
  std::allocator<int>::~allocator(&local_191);
  std::allocator<int>::~allocator(&local_171);
  std::allocator<int>::~allocator(&local_151);
  this_01 = (Solution *)operator_new(1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"dbbca",&local_201);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"aabcc",&local_229);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"aadbbcbcac",(allocator *)((long)&one + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&one + 7));
  Solution::maximumsSplicedArray
            (this_01,(vector<int,_std::allocator<int>_> *)local_28,
             (vector<int,_std::allocator<int>_> *)local_70);
  this_02 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_02,1);
  this_03 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_03,1);
  this_04 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_04,2);
  this_05 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_05,3);
  this_06 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_06,4);
  this_07 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_07,4);
  this_08 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_08,5);
  this_09 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_09,6);
  this_10 = (ListNode *)operator_new(0x10);
  ListNode::ListNode(this_10,7);
  this_02->next = this_06;
  this_06->next = this_08;
  this_03->next = this_05;
  this_05->next = this_07;
  this_04->next = this_09;
  local_2c8 = &local_2e0;
  local_2c0 = 3;
  this_00 = (allocator<ListNode_*> *)
            ((long)&rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  local_2e0 = this_02;
  local_2d8 = this_03;
  local_2d0 = this_04;
  lists.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this_10;
  std::allocator<ListNode_*>::allocator(this_00);
  __l_00._M_len = local_2c0;
  __l_00._M_array = local_2c8;
  std::vector<ListNode_*,_std::allocator<ListNode_*>_>::vector
            ((vector<ListNode_*,_std::allocator<ListNode_*>_> *)local_2b8,__l_00,this_00);
  std::allocator<ListNode_*>::~allocator
            ((allocator<ListNode_*> *)
             ((long)&rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_328[0] = 1;
  local_328[1] = 0;
  local_328[2] = 1;
  local_328[3] = 1;
  local_328[4] = 1;
  local_310 = local_328;
  local_308 = 5;
  std::allocator<int>::allocator(&local_329);
  __l._M_len = local_308;
  __l._M_array = local_310;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_300,__l,&local_329);
  std::allocator<int>::~allocator(&local_329);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_300);
  std::vector<ListNode_*,_std::allocator<ListNode_*>_>::~vector
            ((vector<ListNode_*,_std::allocator<ListNode_*>_> *)local_2b8);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_200);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_b8 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return aa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<int> aa = {60,60,60};
    vector<int> bb = {10,90,10};
//    vector<vector<int>> ss = {{0,1}, {0,2}, {1,2}};
    vector<vector<int>> ss = {{0, 2},
                              {0, 5},
                              {2, 4},
                              {1, 6},
                              {5, 4}};
    auto *a = new Solution();
    string stra = "dbbca";
    string strb = "aabcc";
    string strc = "aadbbcbcac";
    a->maximumsSplicedArray(aa, bb);

    ListNode *one = new ListNode(1);
    ListNode *one1 = new ListNode(1);
    ListNode *two = new ListNode(2);
    ListNode *three = new ListNode(3);
    ListNode *four = new ListNode(4);
    ListNode *four1 = new ListNode(4);
    ListNode *five = new ListNode(5);
    ListNode *six = new ListNode(6);
    ListNode *seven = new ListNode(7);

    one->next = four;
    four->next = five;
    one1->next = three;
    three->next = four1;
    two->next = six;
    vector<ListNode *> lists = {one, one1, two};

    vector<int> rotateArray = {1, 0, 1, 1, 1};

}